

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcColourRgb::~IfcColourRgb(IfcColourRgb *this)

{
  ~IfcColourRgb((IfcColourRgb *)
                ((long)&(this->super_IfcColourSpecification).
                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>.
                        _vptr_ObjectHelper +
                (long)(this->super_IfcColourSpecification).
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>.
                      _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcColourRgb() : Object("IfcColourRgb") {}